

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

ssh_key * eddsa_new_priv_openssh(ssh_keyalg *alg,BinarySource *src)

{
  _Bool _Var1;
  ec_curve *curve;
  undefined8 *puVar2;
  EdwardsPoint *pEVar3;
  mp_int *pmVar4;
  ptrlen pl1;
  ptrlen pVar5;
  ptrlen pl2;
  BinarySource subsrc [1];
  BinarySource local_58;
  
  curve = (ec_curve *)(**alg->extra)();
  if (curve->type != EC_EDWARDS) {
    __assert_fail("curve->type == EC_EDWARDS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                  ,0x34d,"ssh_key *eddsa_new_priv_openssh(const ssh_keyalg *, BinarySource *)");
  }
  pl1 = BinarySource_get_string(src->binarysource_);
  pVar5 = BinarySource_get_string(src->binarysource_);
  local_58.len = pVar5.len;
  local_58.data = pVar5.ptr;
  if ((src->binarysource_->err == BSE_NO_ERROR) && (pl1.len == curve->fieldBytes)) {
    local_58.binarysource_ = &local_58;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    pVar5 = BinarySource_get_data(local_58.binarysource_,pl1.len);
    pl2 = BinarySource_get_data(local_58.binarysource_,curve->fieldBytes);
    if (((local_58.binarysource_)->err == BSE_NO_ERROR) &&
       (((local_58.binarysource_)->len == (local_58.binarysource_)->pos &&
        (_Var1 = ptrlen_eq_ptrlen(pl1,pl2), _Var1)))) {
      puVar2 = (undefined8 *)safemalloc(1,0x20,0);
      puVar2[3] = alg;
      *puVar2 = curve;
      puVar2[2] = 0;
      pEVar3 = eddsa_decode(pl1,curve);
      puVar2[1] = pEVar3;
      if (pEVar3 != (EdwardsPoint *)0x0) {
        pmVar4 = mp_from_bytes_le(pVar5);
        puVar2[2] = pmVar4;
        return (ssh_key *)(puVar2 + 3);
      }
      eddsa_freekey((ssh_key *)(puVar2 + 3));
    }
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *eddsa_new_priv_openssh(
    const ssh_keyalg *alg, BinarySource *src)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    ptrlen pubkey_pl = get_string(src);
    ptrlen privkey_extended_pl = get_string(src);
    if (get_err(src) || pubkey_pl.len != curve->fieldBytes)
        return NULL;

    /*
     * The OpenSSH format for ed25519 private keys also for some
     * reason encodes an extra copy of the public key in the second
     * half of the secret-key string. Check that that's present and
     * correct as well, otherwise the key we think we've imported
     * won't behave identically to the way OpenSSH would have treated
     * it.
     *
     * We assume that Ed448 will work the same way, as and when
     * OpenSSH implements it, which at the time of writing this they
     * had not.
     */
    BinarySource subsrc[1];
    BinarySource_BARE_INIT_PL(subsrc, privkey_extended_pl);
    ptrlen privkey_pl = get_data(subsrc, curve->fieldBytes);
    ptrlen pubkey_copy_pl = get_data(subsrc, curve->fieldBytes);
    if (get_err(subsrc) || get_avail(subsrc))
        return NULL;
    if (!ptrlen_eq_ptrlen(pubkey_pl, pubkey_copy_pl))
        return NULL;

    struct eddsa_key *ek = snew(struct eddsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = eddsa_decode(pubkey_pl, curve);
    if (!ek->publicKey) {
        eddsa_freekey(&ek->sshk);
        return NULL;
    }

    ek->privateKey = mp_from_bytes_le(privkey_pl);

    return &ek->sshk;
}